

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O1

uint128_c_t farmhash128_cc_city_with_seed(char *s,size_t len,uint128_c_t seed)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  size_t sVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint128_c_t uVar16;
  
  uVar12 = seed.b;
  uVar6 = seed.a;
  if (0x7f < len) {
    uVar15 = len * -0x4b6d499041670d8d;
    uVar8 = ((uVar12 ^ 0xb492b66fbe98f273) >> 0x31 | (uVar12 ^ 0xb492b66fbe98f273) << 0xf) *
            -0x4b6d499041670d8d + *(long *)s;
    lVar7 = (uVar8 >> 0x2a | uVar8 * 0x400000) * -0x4b6d499041670d8d + *(long *)(s + 8);
    uVar4 = (uVar15 + uVar12 >> 0x23 | (uVar15 + uVar12) * 0x20000000) * -0x4b6d499041670d8d + uVar6
    ;
    uVar9 = (*(long *)(s + 0x58) + uVar6 >> 0x35 | (*(long *)(s + 0x58) + uVar6) * 0x800) *
            -0x4b6d499041670d8d;
    plVar3 = (long *)(s + 0x78);
    sVar11 = len;
    do {
      uVar6 = uVar6 + uVar12 + uVar8 + plVar3[-0xe];
      uVar12 = uVar12 + lVar7 + plVar3[-9];
      uVar6 = (uVar6 >> 0x25 | uVar6 * 0x8000000) * -0x4b6d499041670d8d ^ uVar9;
      lVar2 = uVar8 + plVar3[-10] + (uVar12 >> 0x2a | uVar12 * 0x400000) * -0x4b6d499041670d8d;
      lVar1 = (uVar15 + uVar4 >> 0x21 | (uVar15 + uVar4) * 0x80000000) * -0x4b6d499041670d8d;
      lVar5 = lVar7 * -0x4b6d499041670d8d + plVar3[-0xf];
      uVar4 = uVar4 + lVar5 + plVar3[-0xc] + uVar6;
      uVar12 = plVar3[-0xe] + lVar5 + plVar3[-0xd];
      lVar7 = uVar12 + plVar3[-0xc];
      lVar5 = (uVar12 >> 0x2c | uVar12 * 0x100000) + lVar5 + (uVar4 >> 0x15 | uVar4 << 0x2b);
      lVar10 = uVar9 + lVar1 + plVar3[-0xb];
      uVar12 = plVar3[-0xd] + lVar10 + lVar2 + plVar3[-8];
      uVar4 = plVar3[-10] + plVar3[-9] + lVar10;
      lVar13 = uVar4 + plVar3[-8];
      uVar4 = (uVar4 >> 0x2c | uVar4 * 0x100000) + lVar10 + (uVar12 >> 0x15 | uVar12 << 0x2b);
      uVar12 = lVar1 + lVar7 + plVar3[-6] + lVar2;
      uVar8 = lVar2 + plVar3[-1] + lVar5;
      uVar15 = (uVar12 >> 0x25 | uVar12 * 0x8000000) * -0x4b6d499041670d8d ^ uVar4;
      uVar12 = lVar7 + plVar3[-2] + (uVar8 >> 0x2a | uVar8 * 0x400000) * -0x4b6d499041670d8d;
      uVar6 = uVar6 + lVar13;
      uVar6 = (uVar6 >> 0x21 | uVar6 * 0x80000000) * -0x4b6d499041670d8d;
      lVar7 = lVar5 * -0x4b6d499041670d8d + plVar3[-7];
      uVar14 = lVar13 + uVar15 + plVar3[-4] + lVar7;
      uVar9 = plVar3[-6] + plVar3[-5] + lVar7;
      uVar8 = uVar9 + plVar3[-4];
      lVar7 = (uVar9 >> 0x2c | uVar9 * 0x100000) + lVar7 + (uVar14 >> 0x15 | uVar14 << 0x2b);
      lVar1 = uVar4 + uVar6 + plVar3[-3];
      uVar9 = plVar3[-5] + uVar12 + *plVar3 + lVar1;
      uVar14 = plVar3[-2] + plVar3[-1] + lVar1;
      uVar4 = uVar14 + *plVar3;
      uVar9 = (uVar14 >> 0x2c | uVar14 * 0x100000) + lVar1 + (uVar9 >> 0x15 | uVar9 << 0x2b);
      sVar11 = sVar11 - 0x80;
      plVar3 = plVar3 + 0x10;
    } while (0x7f < sVar11);
    uVar6 = (uVar8 + uVar15 >> 0x31 | (uVar8 + uVar15) * 0x8000) * -0x3c5a37a36834ced9 + uVar6;
    lVar2 = (uVar9 >> 0x25 | uVar9 * 0x8000000) + uVar12 * -0x3c5a37a36834ced9;
    lVar1 = (uVar4 >> 0x1b | uVar4 << 0x25) + uVar15 * -0x3c5a37a36834ced9;
    uVar4 = uVar4 * 9;
    uVar8 = uVar8 * -0x3c5a37a36834ced9;
    if (sVar11 != 0) {
      plVar3 = (long *)(s + (len - 8));
      uVar12 = 0;
      do {
        uVar12 = uVar12 + 0x20;
        lVar2 = (lVar2 + uVar6 >> 0x2a | (lVar2 + uVar6) * 0x400000) * -0x3c5a37a36834ced9 + lVar7;
        uVar4 = uVar4 + plVar3[-1];
        uVar6 = uVar6 * -0x3c5a37a36834ced9 + uVar4;
        lVar1 = lVar1 + uVar9 + plVar3[-3];
        uVar9 = uVar9 + uVar8;
        lVar5 = plVar3[-3] + uVar8 + lVar1;
        uVar15 = lVar7 + *plVar3 + lVar5;
        uVar8 = plVar3[-1] + plVar3[-2] + lVar5;
        lVar7 = (uVar8 >> 0x2c | uVar8 * 0x100000) + lVar5 + (uVar15 >> 0x15 | uVar15 << 0x2b);
        uVar8 = (uVar8 + *plVar3) * -0x3c5a37a36834ced9;
        plVar3 = plVar3 + -4;
      } while (uVar12 < sVar11);
    }
    uVar12 = (uVar6 ^ uVar8) * -0x622015f714c7d297;
    uVar12 = (uVar12 >> 0x2f ^ uVar8 ^ uVar12) * -0x622015f714c7d297;
    lVar5 = (uVar12 >> 0x2f ^ uVar12) * -0x622015f714c7d297;
    uVar12 = (lVar1 + lVar2 ^ uVar4) * -0x622015f714c7d297;
    uVar12 = (uVar12 >> 0x2f ^ uVar4 ^ uVar12) * -0x622015f714c7d297;
    uVar12 = uVar12 >> 0x2f ^ uVar12;
    uVar6 = (lVar5 + lVar7 ^ uVar9) * -0x622015f714c7d297;
    uVar6 = (uVar6 >> 0x2f ^ uVar9 ^ uVar6) * -0x622015f714c7d297;
    uVar6 = ((uVar6 >> 0x2f ^ uVar6) + uVar12) * -0x622015f714c7d297;
    uVar4 = uVar12 * -0x622015f714c7d297 + lVar7;
    uVar12 = lVar5 + uVar9 ^ uVar4;
    goto LAB_0018498c;
  }
  if ((long)len < 0x11) {
    lVar7 = -0x651e95c4d06fbfb1;
    if (len < 8) {
      if (3 < len) {
        lVar7 = len * 2 + -0x651e95c4d06fbfb1;
        uVar4 = (len + (ulong)*(uint *)s * 8 ^ (ulong)*(uint *)(s + (len - 4))) * lVar7;
        uVar4 = (uVar4 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar4) * lVar7;
        uVar4 = uVar4 >> 0x2f ^ uVar4;
        goto LAB_0018491c;
      }
      if (len != 0) {
        uVar4 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
        lVar7 = (uVar4 >> 0x2f ^ uVar4) * -0x651e95c4d06fbfb1;
      }
    }
    else {
      lVar7 = len * 2 + -0x651e95c4d06fbfb1;
      uVar8 = *(long *)s + 0x9ae16a3b2f90404f;
      uVar4 = *(ulong *)(s + (len - 8));
      uVar9 = ((uVar8 >> 0x19 | uVar8 << 0x27) + uVar4) * lVar7;
      uVar4 = ((uVar4 >> 0x25 | uVar4 << 0x1b) * lVar7 + uVar8 ^ uVar9) * lVar7;
      uVar4 = (uVar4 >> 0x2f ^ uVar9 ^ uVar4) * lVar7;
      uVar4 = uVar4 >> 0x2f ^ uVar4;
LAB_0018491c:
      lVar7 = uVar4 * lVar7;
    }
    uVar4 = lVar7 + uVar12 * -0x4b6d499041670d8d;
    uVar6 = (uVar6 * -0x4b6d499041670d8d >> 0x2f ^ uVar6 * -0x4b6d499041670d8d) *
            -0x4b6d499041670d8d;
    uVar8 = uVar4;
    if (7 < len) {
      uVar8 = *(ulong *)s;
    }
    uVar8 = uVar8 + uVar6 >> 0x2f ^ uVar8 + uVar6;
  }
  else {
    uVar4 = (*(long *)(s + (len - 8)) + 0xb492b66fbe98f273U ^ uVar6) * -0x622015f714c7d297;
    uVar4 = (uVar4 >> 0x2f ^ uVar6 ^ uVar4) * -0x622015f714c7d297;
    uVar4 = (uVar4 >> 0x2f ^ uVar4) * -0x622015f714c7d297;
    uVar8 = (uVar12 + len ^ *(long *)(s + (len - 0x10)) + uVar4) * -0x622015f714c7d297;
    uVar8 = (uVar8 >> 0x2f ^ *(long *)(s + (len - 0x10)) + uVar4 ^ uVar8) * -0x622015f714c7d297;
    uVar8 = (uVar8 >> 0x2f ^ uVar8) * -0x622015f714c7d297;
    uVar6 = uVar6 + uVar8;
    lVar7 = len + 0x10;
    do {
      uVar6 = (((ulong)(*(long *)s * -0x4b6d499041670d8d) >> 0x2f ^ *(long *)s * -0x4b6d499041670d8d
               ) * -0x4b6d499041670d8d ^ uVar6) * -0x4b6d499041670d8d;
      uVar12 = uVar12 ^ uVar6;
      uVar4 = (((ulong)(*(long *)((long)s + 8) * -0x4b6d499041670d8d) >> 0x2f ^
               *(long *)((long)s + 8) * -0x4b6d499041670d8d) * -0x4b6d499041670d8d ^ uVar4) *
              -0x4b6d499041670d8d;
      uVar8 = uVar8 ^ uVar4;
      s = (char *)((long)s + 0x10);
      lVar7 = lVar7 + -0x10;
    } while (0x20 < lVar7);
  }
  uVar6 = (uVar6 ^ uVar4) * -0x622015f714c7d297;
  uVar6 = (uVar6 >> 0x2f ^ uVar4 ^ uVar6) * -0x622015f714c7d297;
  uVar4 = (uVar6 >> 0x2f ^ uVar6) * -0x622015f714c7d297;
  uVar6 = (uVar8 ^ uVar12) * -0x622015f714c7d297;
  uVar12 = (uVar6 >> 0x2f ^ uVar12 ^ uVar6) * -0x622015f714c7d297;
  uVar6 = (uVar12 >> 0x2f ^ uVar12) * -0x622015f714c7d297 ^ uVar4;
  uVar12 = uVar6;
LAB_0018498c:
  uVar12 = (uVar12 * -0x622015f714c7d297 >> 0x2f ^ uVar4 ^ uVar12 * -0x622015f714c7d297) *
           -0x622015f714c7d297;
  uVar16.b = (uVar12 >> 0x2f ^ uVar12) * -0x622015f714c7d297;
  uVar16.a = uVar6;
  return uVar16;
}

Assistant:

uint128_c_t farmhash128_cc_city_with_seed(const char *s, size_t len, uint128_c_t seed) {
  if (len < 128) {
    return farmhash_cc_city_murmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  uint128_c_t v, w;
  uint64_t x = uint128_c_t_low64(seed);
  uint64_t y = uint128_c_t_high64(seed);
  uint64_t z = len * k1;
  size_t tail_done;

  v.a = ror64(y ^ k1, 49) * k1 + fetch64(s);
  v.b = ror64(v.a, 42) * k1 + fetch64(s + 8);
  w.a = ror64(y + z, 35) * k1 + x;
  w.b = ror64(x + fetch64(s + 88), 53) * k1;

  // This is the same inner loop as cityhash64(), manually unrolled.
  do {
    x = ror64(x + y + v.a + fetch64(s + 8), 37) * k1;
    y = ror64(y + v.b + fetch64(s + 48), 42) * k1;
    x ^= w.b;
    y += v.a + fetch64(s + 40);
    z = ror64(z + w.a, 33) * k1;
    v = weak_farmhash_cc_len_32_with_seeds(s, v.b * k1, x + w.a);
    w = weak_farmhash_cc_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
    swap64(&z, &x);
    s += 64;
    x = ror64(x + y + v.a + fetch64(s + 8), 37) * k1;
    y = ror64(y + v.b + fetch64(s + 48), 42) * k1;
    x ^= w.b;
    y += v.a + fetch64(s + 40);
    z = ror64(z + w.a, 33) * k1;
    v = weak_farmhash_cc_len_32_with_seeds(s, v.b * k1, x + w.a);
    w = weak_farmhash_cc_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
    swap64(&z, &x);
    s += 64;
    len -= 128;
  } while (likely(len >= 128));
  x += ror64(v.a + z, 49) * k0;
  y = y * k0 + ror64(w.b, 37);
  z = z * k0 + ror64(w.a, 27);
  w.a *= 9;
  v.a *= k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = ror64(x + y, 42) * k0 + v.b;
    w.a += fetch64(s + len - tail_done + 16);
    x = x * k0 + w.a;
    z += w.b + fetch64(s + len - tail_done);
    w.b += v.a;
    v = weak_farmhash_cc_len_32_with_seeds(s + len - tail_done, v.a + z, v.b);
    v.a *= k0;
  }
  // At this point our 56 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 56-byte-to-8-byte hashes to get a 16-byte final result.
  x = farmhash_len_16(x, v.a);
  y = farmhash_len_16(y + z, w.a);
  return make_uint128_c_t(farmhash_len_16(x + v.b, w.b) + y,
                   farmhash_len_16(x + w.b, y + v.b));
}